

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O3

void __thiscall BPlusTree::PrintNodeWithoutPtr(BPlusTree *this,shared_ptr<Node> *node)

{
  element_type *peVar1;
  pointer pfVar2;
  ulong uVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pfVar2 = (peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    uVar4 = 0;
    do {
      std::ostream::_M_insert<double>((double)pfVar2[uVar4]);
      peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pfVar2 = (peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
      if (uVar4 != uVar3 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pfVar2 = (peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = (long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void BPlusTree::PrintNodeWithoutPtr(std::shared_ptr<Node> node) {
    std::cout << "[";
    for (int i = 0; i < node->keys.size(); i++) {
        std::cout << node->keys[i];
        if (i != node->keys.size() - 1) {
            std::cout << " | ";
        }
    }
    std::cout << "]" << std::endl;
}